

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O0

void __thiscall
TaprootUtil_CreateTapScriptControl_Elements_Test::TestBody
          (TaprootUtil_CreateTapScriptControl_Elements_Test *this)

{
  allocator<cfd::core::ByteData256> *this_00;
  initializer_list<cfd::core::ByteData256> __l;
  NetType_conflict type;
  bool bVar1;
  char *pcVar2;
  ScriptBuilder *pSVar3;
  reference pvVar4;
  reference this_01;
  char *in_R9;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *utxo_list_00;
  ByteData256 *local_1068;
  string local_1010;
  AssertHelper local_ff0;
  Message local_fe8;
  bool local_fd9;
  undefined1 local_fd8 [8];
  AssertionResult gtest_ar__1;
  Message local_fc0;
  string local_fb8;
  undefined1 local_f98 [8];
  AssertionResult gtest_ar_8;
  ByteData local_f68;
  ScriptWitness local_f50;
  ByteData local_f30;
  ScriptWitness local_f18;
  undefined1 local_ef8 [8];
  SchnorrSignature schnorr_sig;
  Message local_ec8;
  string local_ec0;
  undefined1 local_ea0 [8];
  AssertionResult gtest_ar_7;
  SchnorrSignature sig2;
  Message local_e60;
  string local_e58;
  undefined1 local_e38 [8];
  AssertionResult gtest_ar_6;
  SigHashType local_e0c;
  undefined1 local_e00 [8];
  ByteData256 sighash2;
  undefined1 local_dd0 [8];
  TapScriptData script_data;
  allocator<cfd::core::ConfidentialTxOut> local_cb1;
  undefined1 local_cb0 [8];
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> utxo_list;
  Amount fee2;
  undefined1 local_c50 [8];
  ConfidentialValue val2;
  Amount amt2;
  allocator local_bf9;
  string local_bf8;
  undefined1 local_bd8 [8];
  Address addr2;
  undefined1 local_a38 [8];
  ConfidentialTransaction tx2;
  string local_9f0;
  undefined1 local_9d0 [8];
  BlockHash genesis_block_hash;
  Message local_9a8;
  string local_9a0;
  undefined1 local_980 [8];
  AssertionResult gtest_ar_5;
  ScriptWitness local_958;
  ScriptWitness local_938;
  undefined1 local_918 [8];
  ByteData der_sig;
  ByteData sig;
  ByteData local_8d8;
  undefined1 local_8c0 [8];
  ByteData256 sighash;
  SigHashType sighash_type;
  Script pkh_script1;
  string local_858;
  undefined1 local_838 [8];
  Pubkey pk1;
  string local_818;
  undefined1 local_7f8 [8];
  Privkey key1;
  Message local_7d0;
  string local_7c8;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_4;
  Amount fee1;
  ConfidentialValue val1;
  Amount amt1;
  ConfidentialValue val0;
  Amount amt0;
  string local_710;
  Txid local_6f0;
  allocator local_6c9;
  string local_6c8;
  undefined1 local_6a8 [8];
  ConfidentialAssetId asset;
  ConfidentialTransaction tx1;
  Message local_638;
  Script local_630;
  string local_5f8;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_3;
  Message local_5c0;
  Script local_5b8;
  string local_580;
  string local_560;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_2;
  Message local_528;
  string local_520;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_4d8 [8];
  Address addr01;
  ByteData taproot_control;
  SchnorrPubkey pk0;
  Script locking_script;
  undefined1 local_2d8 [8];
  TaprootScriptTree tree;
  NetType net_type;
  allocator local_211;
  string local_210;
  ByteData256 *local_1f0;
  ByteData256 local_1e8;
  ByteData256 local_1d0;
  undefined1 local_1b8 [24];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ScriptBuilder local_178;
  undefined1 local_158 [8];
  Script redeem_script;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  Message local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  SchnorrPubkey schnorr_pubkey;
  undefined1 local_80 [7];
  bool is_parity;
  Pubkey pubkey;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootUtil_CreateTapScriptControl_Elements_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)local_80,(Privkey *)local_30,true);
  schnorr_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)&gtest_ar.message_,(Pubkey *)local_80,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_d0,(SchnorrPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_b0,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "schnorr_pubkey.GetHex()",(char (*) [65])0x722a65,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f0,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &redeem_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_f0,
               (AssertionResult *)"is_parity","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string
              ((string *)
               &redeem_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_178);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_)
  ;
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (&local_178,
                      (ByteData *)
                      &nodes.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_158,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_178);
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_1f0 = &local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_210,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"
             ,&local_211);
  cfd::core::ByteData256::ByteData256(&local_1e8,&local_210);
  local_1f0 = &local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&net_type,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256(&local_1d0,(string *)&net_type);
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_1b8._0_8_ = &local_1e8;
  local_1b8._8_8_ = (pointer)0x2;
  this_00 = (allocator<cfd::core::ByteData256> *)
            ((long)&tree.nodes_.
                    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::ByteData256>::allocator(this_00);
  __l._M_len = local_1b8._8_8_;
  __l._M_array = (iterator)local_1b8._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1b8 + 0x10),__l,this_00);
  std::allocator<cfd::core::ByteData256>::~allocator
            ((allocator<cfd::core::ByteData256> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_1068 = (ByteData256 *)local_1b8;
  do {
    local_1068 = local_1068 + -1;
    cfd::core::ByteData256::~ByteData256(local_1068);
  } while (local_1068 != &local_1e8);
  std::__cxx11::string::~string((string *)&net_type);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = kCfdInvalidSettingError;
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_2d8,(Script *)local_158,kElementsRegtest);
  pvVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_1b8 + 0x10),0);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_2d8,pvVar4);
  pvVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_1b8 + 0x10),1);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
  cfd::core::TapBranch::AddBranch
            ((TapBranch *)local_2d8,
             (SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script
            ((Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((ByteData *)&addr01.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (SchnorrPubkey *)&gtest_ar.message_,(TapBranch *)local_2d8,
             (SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  type = (NetType_conflict)
         tree.nodes_.
         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            ((Address *)local_4d8,type,kVersion1,
             (SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar_1.message_);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar_1.message_);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_520,(Address *)local_4d8);
  testing::internal::EqHelper<false>::Compare<char[64],std::__cxx11::string>
            ((EqHelper<false> *)local_500,
             "\"ert1pugx48kntvdtm5vlr967s5wahgeu0889zwxgle0zn6tk39fp00zwqt6xq6r\"",
             "addr01.GetAddress()",
             (char (*) [64])"ert1pugx48kntvdtm5vlr967s5wahgeu0889zwxgle0zn6tk39fp00zwqt6xq6r",
             &local_520);
  std::__cxx11::string::~string((string *)&local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_560,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Address::GetLockingScript(&local_5b8,(Address *)local_4d8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_580,&local_5b8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_540,"locking_script.GetHex()",
             "addr01.GetLockingScript().GetHex()",&local_560,&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  cfd::core::Script::~Script(&local_5b8);
  std::__cxx11::string::~string((string *)&local_560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  cfd::core::Address::GetLockingScript(&local_630,(Address *)local_4d8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_5f8,&local_630);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_5d8,
             "\"5120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c\"",
             "addr01.GetLockingScript().GetHex()",
             (char (*) [69])"5120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c",
             &local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  cfd::core::Script::~Script(&local_630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tx1.vout_.
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tx1.vout_.
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_638);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tx1.vout_.
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&asset.version_,2,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6c8,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_6c9);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_6a8,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_710,"cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd"
             ,(allocator *)&amt0.field_0xf);
  cfd::core::Txid::Txid(&local_6f0,&local_710);
  cfd::core::ConfidentialTransaction::AddTxIn
            ((ConfidentialTransaction *)&asset.version_,&local_6f0,0,0xffffffff,
             (Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid(&local_6f0);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator((allocator<char> *)&amt0.field_0xf);
  cfd::core::Amount::Amount((Amount *)&val0.version_,2500000000);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&amt1.ignore_check_,(Amount *)&val0.version_);
  cfd::core::Amount::Amount((Amount *)&val1.version_,0x9502f518);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&fee1.ignore_check_,(Amount *)&val1.version_);
  cfd::core::ConfidentialTransaction::AddTxOut
            ((ConfidentialTransaction *)&asset.version_,(Amount *)&val1.version_,
             (ConfidentialAssetId *)local_6a8,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Amount::Amount((Amount *)&gtest_ar_4.message_,1000);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((ConfidentialTransaction *)&asset.version_,(Amount *)&gtest_ar_4.message_,
             (ConfidentialAssetId *)local_6a8);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_7c8,(AbstractTransaction *)&asset.version_);
  testing::internal::EqHelper<false>::Compare<char[349],std::__cxx11::string>
            ((EqHelper<false> *)local_7a8,
             "\"020000000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000\""
             ,"tx1.GetHex()",
             (char (*) [349])
             "020000000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000"
             ,&local_7c8);
  std::__cxx11::string::~string((string *)&local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key1.is_compressed_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key1.is_compressed_,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key1.is_compressed_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_818,"cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57",
             (allocator *)
             ((long)&pk1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::FromWif((Privkey *)local_7f8,&local_818,kCustomChain,true);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_858,
             "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
             (allocator *)
             ((long)&pkh_script1.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_838,&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pkh_script1.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ScriptUtil::CreateP2pkhLockingScript
            ((Script *)&sighash_type.hash_algorithm_,(Pubkey *)local_838);
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::Script::GetData(&local_8d8,(Script *)&sighash_type.hash_algorithm_);
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)
             ((long)&sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::ConfidentialTransaction::GetElementsSignatureHash
            ((ByteData256 *)local_8c0,(ConfidentialTransaction *)&asset.version_,0,&local_8d8,
             (SigHashType *)
             ((long)&sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (ConfidentialValue *)&amt1.ignore_check_,kVersion0);
  cfd::core::ByteData::~ByteData(&local_8d8);
  cfd::core::Privkey::CalculateEcSignature
            ((ByteData *)
             &der_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)local_7f8,
             (ByteData256 *)local_8c0,true);
  cfd::core::CryptoUtil::ConvertSignatureToDer
            ((ByteData *)local_918,
             (ByteData *)
             &der_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_938,(ConfidentialTransaction *)&asset.version_,0,(ByteData *)local_918);
  cfd::core::ScriptWitness::~ScriptWitness(&local_938);
  cfd::core::Pubkey::GetData((ByteData *)&gtest_ar_5.message_,(Pubkey *)local_838);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_958,(ConfidentialTransaction *)&asset.version_,0,
             (ByteData *)&gtest_ar_5.message_);
  cfd::core::ScriptWitness::~ScriptWitness(&local_958);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_5.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_9a0,(AbstractTransaction *)&asset.version_);
  testing::internal::EqHelper<false>::Compare<char[577],std::__cxx11::string>
            ((EqHelper<false> *)local_980,
             "\"020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000247304402204846079d356c76f5c59312b911d4096777aa40c06ffd77dc6836f85b42c1816702201f0df4a850234c82b1fb9c068a96a620d2038419e100eec9b6cff3f377a786130121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000\""
             ,"tx1.GetHex()",
             (char (*) [577])
             "020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000247304402204846079d356c76f5c59312b911d4096777aa40c06ffd77dc6836f85b42c1816702201f0df4a850234c82b1fb9c068a96a620d2038419e100eec9b6cff3f377a786130121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000"
             ,&local_9a0);
  std::__cxx11::string::~string((string *)&local_9a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    testing::Message::Message(&local_9a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_980);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &genesis_block_hash.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &genesis_block_hash.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &genesis_block_hash.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9f0,"cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338"
             ,(allocator *)
              ((long)&tx2.vout_.
                      super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::BlockHash::BlockHash((BlockHash *)local_9d0,&local_9f0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tx2.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_a38,2,0);
  cfd::core::AbstractTransaction::GetTxid
            ((Txid *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AbstractTransaction *)&asset.version_);
  cfd::core::ConfidentialTransaction::AddTxIn
            ((ConfidentialTransaction *)local_a38,
             (Txid *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,0,
             0xffffffff,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid
            ((Txid *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_bf8,"ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0",&local_bf9);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            ((Address *)local_bd8,&local_bf8,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &amt2.ignore_check_);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &amt2.ignore_check_);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
  cfd::core::Amount::Amount((Amount *)&val2.version_,0x9502f130);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_c50,(Amount *)&val2.version_);
  cfd::core::Address::GetLockingScript((Script *)&fee2.ignore_check_,(Address *)local_bd8);
  cfd::core::ConfidentialTransaction::AddTxOut
            ((ConfidentialTransaction *)local_a38,(Amount *)&val2.version_,
             (ConfidentialAssetId *)local_6a8,(Script *)&fee2.ignore_check_);
  cfd::core::Script::~Script((Script *)&fee2.ignore_check_);
  cfd::core::Amount::Amount
            ((Amount *)
             &utxo_list.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,1000);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((ConfidentialTransaction *)&asset.version_,
             (Amount *)
             &utxo_list.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ConfidentialAssetId *)local_6a8);
  std::allocator<cfd::core::ConfidentialTxOut>::allocator(&local_cb1);
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::vector
            ((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *)
             local_cb0,1,&local_cb1);
  std::allocator<cfd::core::ConfidentialTxOut>::~allocator(&local_cb1);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)&script_data.code_separator_position,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ConfidentialAssetId *)local_6a8,
             (ConfidentialValue *)&fee1.ignore_check_);
  this_01 = std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            ::operator[]((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                          *)local_cb0,0);
  cfd::core::ConfidentialTxOut::operator=
            (this_01,(ConfidentialTxOut *)&script_data.code_separator_position);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut
            ((ConfidentialTxOut *)&script_data.code_separator_position);
  cfd::core::TapScriptData::TapScriptData((TapScriptData *)local_dd0);
  cfd::core::TaprootScriptTree::GetTapLeafHash
            ((ByteData256 *)
             &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(TaprootScriptTree *)local_2d8);
  cfd::core::ByteData256::operator=
            ((ByteData256 *)local_dd0,
             (ByteData256 *)
             &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256
            ((ByteData256 *)
             &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SigHashType::SigHashType
            (&local_e0c,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar_6.message_);
  utxo_list_00 = (vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  *)local_cb0;
  cfd::core::ConfidentialTransaction::GetElementsSchnorrSignatureHash
            ((ByteData256 *)local_e00,(ConfidentialTransaction *)local_a38,0,&local_e0c,
             (BlockHash *)local_9d0,utxo_list_00,(TapScriptData *)local_dd0,
             (ByteData *)&gtest_ar_6.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_6.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_e58,(ByteData256 *)local_e00);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_e38,
             "\"10ea5c82c50a85cce83931825bf181c99638e3412e7a0e0f438a4b11485174e8\"",
             "sighash2.GetHex()",
             (char (*) [65])"10ea5c82c50a85cce83931825bf181c99638e3412e7a0e0f438a4b11485174e8",
             &local_e58);
  std::__cxx11::string::~string((string *)&local_e58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e38);
  if (!bVar1) {
    testing::Message::Message(&local_e60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_,&local_e60);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_);
    testing::Message::~Message(&local_e60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e38);
  cfd::core::SchnorrUtil::Sign
            ((SchnorrSignature *)&gtest_ar_7.message_,(ByteData256 *)local_e00,(Privkey *)local_30);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_
            (&local_ec0,(SchnorrSignature *)&gtest_ar_7.message_,false);
  testing::internal::EqHelper<false>::Compare<char[129],std::__cxx11::string>
            ((EqHelper<false> *)local_ea0,
             "\"ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb6\""
             ,"sig2.GetHex()",
             (char (*) [129])
             "ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb6"
             ,&local_ec0);
  std::__cxx11::string::~string((string *)&local_ec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea0);
  if (!bVar1) {
    testing::Message::Message(&local_ec8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ea0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xd0,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_,&local_ec8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_);
    testing::Message::~Message(&local_ec8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea0);
  cfd::core::SchnorrSignature::SchnorrSignature
            ((SchnorrSignature *)local_ef8,(SchnorrSignature *)&gtest_ar_7.message_);
  cfd::core::SchnorrSignature::SetSigHashType
            ((SchnorrSignature *)local_ef8,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::SchnorrSignature::GetData(&local_f30,(SchnorrSignature *)local_ef8,true);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_f18,(ConfidentialTransaction *)local_a38,0,&local_f30);
  cfd::core::ScriptWitness::~ScriptWitness(&local_f18);
  cfd::core::ByteData::~ByteData(&local_f30);
  cfd::core::Script::GetData(&local_f68,(Script *)local_158);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_f50,(ConfidentialTransaction *)local_a38,0,&local_f68);
  cfd::core::ScriptWitness::~ScriptWitness(&local_f50);
  cfd::core::ByteData::~ByteData(&local_f68);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            ((ScriptWitness *)&gtest_ar_8.message_,(ConfidentialTransaction *)local_a38,0,
             (ByteData *)&addr01.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&gtest_ar_8.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_fb8,(AbstractTransaction *)local_a38);
  testing::internal::EqHelper<false>::Compare<char[647],std::__cxx11::string>
            ((EqHelper<false> *)local_f98,
             "\"0200000001019923e6194a15c93658fb458cd38a4fe5326e45298b6dcf9184a022e352bc1c4b0000000000ffffffff010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000341ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb60122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c51777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54000000\""
             ,"tx2.GetHex()",
             (char (*) [647])
             "0200000001019923e6194a15c93658fb458cd38a4fe5326e45298b6dcf9184a022e352bc1c4b0000000000ffffffff010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000341ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb60122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c51777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54000000"
             ,&local_fb8);
  std::__cxx11::string::~string((string *)&local_fb8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f98);
  if (!bVar1) {
    testing::Message::Message(&local_fc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_fc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_fc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f98);
  local_fd9 = cfd::core::SchnorrPubkey::Verify
                        ((SchnorrPubkey *)&gtest_ar.message_,(SchnorrSignature *)local_ef8,
                         (ByteData256 *)local_e00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fd8,&local_fd9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd8);
  if (!bVar1) {
    testing::Message::Message(&local_fe8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1010,(internal *)local_fd8,
               (AssertionResult *)"schnorr_pubkey.Verify(schnorr_sig, sighash2)","false","true",
               (char *)utxo_list_00);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ff0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xd8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ff0,&local_fe8);
    testing::internal::AssertHelper::~AssertHelper(&local_ff0);
    std::__cxx11::string::~string((string *)&local_1010);
    testing::Message::~Message(&local_fe8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd8);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)local_ef8);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)&gtest_ar_7.message_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_e00);
  cfd::core::TapScriptData::~TapScriptData((TapScriptData *)local_dd0);
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::~vector
            ((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *)
             local_cb0);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)local_c50);
  cfd::core::Address::~Address((Address *)local_bd8);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_a38)
  ;
  cfd::core::BlockHash::~BlockHash((BlockHash *)local_9d0);
  cfd::core::ByteData::~ByteData((ByteData *)local_918);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &der_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_8c0);
  cfd::core::Script::~Script((Script *)&sighash_type.hash_algorithm_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_838);
  cfd::core::Privkey::~Privkey((Privkey *)local_7f8);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&fee1.ignore_check_);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&amt1.ignore_check_);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_6a8);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&asset.version_);
  cfd::core::Address::~Address((Address *)local_4d8);
  cfd::core::ByteData::~ByteData
            ((ByteData *)&addr01.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_2d8);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1b8 + 0x10));
  cfd::core::Script::~Script((Script *)local_158);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControl_Elements) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script redeem_script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  NetType net_type = NetType::kElementsRegtest;
  TaprootScriptTree tree(redeem_script, net_type);
  tree.AddBranch(nodes[0]);
  tree.AddBranch(SchnorrPubkey(nodes[1]));
  // auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  // Script locking_script = ScriptUtil::CreateTaprootLockingScript(
  //   pk.GetByteData256());
  Script locking_script;
  SchnorrPubkey pk0;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, &pk0, &locking_script);
  Address addr01(net_type, WitnessVersion::kVersion1, pk0, GetElementsAddressFormatList());
  EXPECT_EQ("ert1pugx48kntvdtm5vlr967s5wahgeu0889zwxgle0zn6tk39fp00zwqt6xq6r", addr01.GetAddress());
  EXPECT_EQ(locking_script.GetHex(), addr01.GetLockingScript().GetHex());
  EXPECT_EQ("5120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c", addr01.GetLockingScript().GetHex());

  ConfidentialTransaction tx1(2, 0);
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  tx1.AddTxIn(
      Txid("cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd"),
      0, 0xffffffff);  // ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0
  Amount amt0(int64_t{2500000000});
  ConfidentialValue val0(amt0);
  Amount amt1(int64_t{2499999000});
  ConfidentialValue val1(amt1);
  tx1.AddTxOut(amt1, asset, locking_script);
  Amount fee1(int64_t{1000});
  tx1.AddTxOutFee(fee1, asset);
  EXPECT_EQ("020000000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000", tx1.GetHex());
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");
  Pubkey pk1("023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44");
  auto pkh_script1 = ScriptUtil::CreateP2pkhLockingScript(pk1);
  SigHashType sighash_type;
  auto sighash = tx1.GetElementsSignatureHash(0, pkh_script1.GetData(),
        sighash_type, val0, WitnessVersion::kVersion0);
  auto sig = key1.CalculateEcSignature(sighash);
  auto der_sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
  tx1.AddScriptWitnessStack(0, der_sig);
  tx1.AddScriptWitnessStack(0, pk1.GetData());
  EXPECT_EQ("020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000247304402204846079d356c76f5c59312b911d4096777aa40c06ffd77dc6836f85b42c1816702201f0df4a850234c82b1fb9c068a96a620d2038419e100eec9b6cff3f377a786130121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000", tx1.GetHex());
  
  BlockHash genesis_block_hash("cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338");
  ConfidentialTransaction tx2(2, 0);
  tx2.AddTxIn(tx1.GetTxid(), 0, 0xffffffff);  // taproot
  Address addr2("ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0", GetElementsAddressFormatList());
  Amount amt2(int64_t{2499998000});
  ConfidentialValue val2(amt2);
  tx2.AddTxOut(amt2, asset, addr2.GetLockingScript());
  Amount fee2(int64_t{1000});
  tx1.AddTxOutFee(fee2, asset);
  std::vector<ConfidentialTxOut> utxo_list(1);
  utxo_list[0] = ConfidentialTxOut(locking_script, asset, val1);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  auto sighash2 = tx2.GetElementsSchnorrSignatureHash(
    0, sighash_type, genesis_block_hash, utxo_list, &script_data);
  EXPECT_EQ("10ea5c82c50a85cce83931825bf181c99638e3412e7a0e0f438a4b11485174e8", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb6", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx2.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx2.AddScriptWitnessStack(0, redeem_script.GetData());
  tx2.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("0200000001019923e6194a15c93658fb458cd38a4fe5326e45298b6dcf9184a022e352bc1c4b0000000000ffffffff010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000341ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb60122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c51777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54000000", tx2.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}